

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

FSerializer * Serialize(FSerializer *arc,char *key,part *part,part *def)

{
  bool bVar1;
  int iVar2;
  FSerializer *pFVar3;
  part *ppVar4;
  part *ppVar5;
  
  bVar1 = FSerializer::canSkip(arc);
  if ((def != (part *)0x0 && bVar1) && (iVar2 = bcmp(part,def,0x30), iVar2 == 0)) {
    return arc;
  }
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    ppVar5 = (part *)0x0;
    ppVar4 = def;
    if (save_full != false) {
      ppVar4 = ppVar5;
    }
    pFVar3 = Serialize(arc,"xoffset",&part->xOffset,&ppVar4->xOffset);
    ppVar4 = (part *)&def->yOffset;
    if (save_full != false) {
      ppVar4 = ppVar5;
    }
    pFVar3 = Serialize(pFVar3,"yoffset",&part->yOffset,&ppVar4->xOffset);
    ppVar4 = (part *)&def->xScale;
    if (save_full != false) {
      ppVar4 = ppVar5;
    }
    pFVar3 = Serialize(pFVar3,"xscale",&part->xScale,&ppVar4->xOffset);
    ppVar4 = (part *)&def->yScale;
    if (save_full != false) {
      ppVar4 = ppVar5;
    }
    pFVar3 = Serialize(pFVar3,"yscale",&part->yScale,&ppVar4->xOffset);
    ppVar4 = (part *)&def->texture;
    if (save_full != false) {
      ppVar4 = ppVar5;
    }
    pFVar3 = Serialize(pFVar3,"texture",&part->texture,(FTextureID *)ppVar4);
    Serialize(pFVar3,"interpolation",(DObject **)&part->interpolation,(DObject **)0x0,(bool *)0x0);
    FSerializer::EndObject(pFVar3);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, side_t::part &part, side_t::part *def)
{
	if (arc.canSkip() && def != nullptr && !memcmp(&part, def, sizeof(part)))
	{
		return arc;
	}

	if (arc.BeginObject(key))
	{
		arc("xoffset", part.xOffset, def->xOffset)
			("yoffset", part.yOffset, def->yOffset)
			("xscale", part.xScale, def->xScale)
			("yscale", part.yScale, def->yScale)
			("texture", part.texture, def->texture)
			("interpolation", part.interpolation)
			.EndObject();
	}
	return arc;
}